

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriCommon.c
# Opt level: O3

UriBool uriRemoveDotSegmentsExA
                  (UriUriA *uri,UriBool relative,UriBool pathOwned,UriMemoryManager *memory)

{
  UriPathSegmentA **ppUVar1;
  char *pcVar2;
  char *pcVar3;
  void *pvVar4;
  char *pcVar5;
  UriPathSegmentA *pUVar6;
  int iVar7;
  UriPathSegmentA **ppUVar8;
  char *pcVar9;
  UriPathSegmentA *pUVar10;
  UriPathSegmentA *pUVar11;
  UriPathSegmentA *segment;
  UriPathSegmentStructA *pUVar12;
  
  if ((uri != (UriUriA *)0x0) && (pUVar11 = uri->pathHead, pUVar11 != (UriPathSegmentA *)0x0)) {
    ppUVar1 = &uri->pathHead;
    pUVar11->reserved = (void *)0x0;
    do {
      pcVar2 = (pUVar11->text).first;
      pcVar3 = (pUVar11->text).afterLast;
      iVar7 = (int)pcVar3 - (int)pcVar2;
      if (iVar7 == 2) {
        if ((*pcVar2 != '.') || (pcVar2[1] != '.')) goto LAB_001b67aa;
        pUVar12 = pUVar11->next;
        pUVar10 = (UriPathSegmentA *)pUVar11->reserved;
        if (relative == 0) {
          if (pUVar10 == (UriPathSegmentA *)0x0) {
            if (pUVar12 == (UriPathSegmentStructA *)0x0) {
              if (uri->absolutePath == 0) {
                if ((pathOwned != 0) && (pcVar2 != pcVar3)) {
                  (*memory->free)(memory,pcVar2);
                }
                goto LAB_001b69e2;
              }
              *ppUVar1 = (UriPathSegmentA *)0x0;
              uri->pathTail = (UriPathSegmentA *)0x0;
            }
            else {
              *ppUVar1 = pUVar12;
              pUVar12->reserved = (void *)0x0;
            }
            goto LAB_001b6750;
          }
        }
        else if ((pUVar10 == (UriPathSegmentA *)0x0) ||
                (((pcVar9 = (pUVar10->text).first,
                  (long)(pUVar10->text).afterLast - (long)pcVar9 == 2 && (*pcVar9 == '.')) &&
                 (pcVar9[1] == '.')))) goto LAB_001b67aa;
        pvVar4 = pUVar10->reserved;
        if (pvVar4 == (void *)0x0) {
          if (pUVar12 == (UriPathSegmentStructA *)0x0) {
            if ((pathOwned != 0) && (pcVar2 != pcVar3)) {
              (*memory->free)(memory,pcVar2);
            }
            (pUVar11->text).first = "X";
            (pUVar11->text).afterLast = "X";
            uri->pathHead = pUVar11;
            uri->pathTail = pUVar11;
          }
          else {
            *ppUVar1 = pUVar12;
            pUVar12->reserved = (void *)0x0;
            if ((pathOwned != 0) && (pcVar2 != pcVar3)) {
              (*memory->free)(memory,pcVar2);
            }
            (*memory->free)(memory,pUVar11);
          }
          if (pathOwned == 0) goto LAB_001b6912;
LAB_001b68fc:
          pUVar11 = (UriPathSegmentA *)(pUVar10->text).first;
          if (pUVar11 == (UriPathSegmentA *)(pUVar10->text).afterLast) goto LAB_001b6912;
        }
        else {
          *(UriPathSegmentStructA **)((long)pvVar4 + 0x10) = pUVar12;
          if (pUVar11->next == (UriPathSegmentStructA *)0x0) {
            pUVar6 = (UriPathSegmentA *)(*memory->calloc)(memory,1,0x20);
            if (pUVar6 == (UriPathSegmentA *)0x0) {
              if (pathOwned != 0) {
                pcVar2 = (pUVar11->text).first;
                if (pcVar2 != (pUVar11->text).afterLast) {
                  (*memory->free)(memory,pcVar2);
                }
                (*memory->free)(memory,pUVar11);
                pUVar11 = (UriPathSegmentA *)(pUVar10->text).first;
                if (pUVar11 == (UriPathSegmentA *)(pUVar10->text).afterLast) goto LAB_001b6a00;
              }
              (*memory->free)(memory,pUVar11);
LAB_001b6a00:
              (*memory->free)(memory,pUVar10);
              return 0;
            }
            (pUVar6->text).first = "X";
            (pUVar6->text).afterLast = "X";
            *(UriPathSegmentA **)((long)pvVar4 + 0x10) = pUVar6;
            uri->pathTail = pUVar6;
          }
          else {
            pUVar11->next->reserved = pvVar4;
          }
          if (pathOwned != 0) {
            pcVar2 = (pUVar11->text).first;
            if (pcVar2 != (pUVar11->text).afterLast) {
              (*memory->free)(memory,pcVar2);
            }
            (*memory->free)(memory,pUVar11);
            goto LAB_001b68fc;
          }
        }
        (*memory->free)(memory,pUVar11);
LAB_001b6912:
        (*memory->free)(memory,pUVar10);
        pUVar11 = pUVar12;
      }
      else {
        if ((iVar7 == 1) && (*pcVar2 == '.')) {
          pUVar12 = pUVar11->next;
          pvVar4 = pUVar11->reserved;
          if ((relative == 0) || (pUVar12 == (UriPathSegmentStructA *)0x0 || pUVar11 != *ppUVar1)) {
            if (pUVar12 == (UriPathSegmentStructA *)0x0) {
              if ((pathOwned != 0) && (pcVar2 != pcVar3)) {
                (*memory->free)(memory,pcVar2);
              }
              if ((((pvVar4 == (void *)0x0) && ((uri->hostText).first == (char *)0x0)) &&
                  ((uri->hostData).ip4 == (UriIp4 *)0x0)) &&
                 (((uri->hostData).ip6 == (UriIp6 *)0x0 &&
                  ((uri->hostData).ipFuture.first == (char *)0x0)))) {
                (*memory->free)(memory,pUVar11);
                *ppUVar1 = (UriPathSegmentA *)0x0;
                uri->pathTail = (UriPathSegmentA *)0x0;
                return 1;
              }
LAB_001b69e2:
              (pUVar11->text).first = "X";
              (pUVar11->text).afterLast = "X";
              return 1;
            }
          }
          else {
            pcVar9 = (pUVar12->text).first;
            pcVar5 = (pUVar12->text).afterLast;
            if (pcVar9 < pcVar5) {
              do {
                if (*pcVar9 == ':') goto LAB_001b67aa;
                pcVar9 = pcVar9 + 1;
              } while (pcVar9 != pcVar5);
            }
          }
          ppUVar8 = (UriPathSegmentA **)((long)pvVar4 + 0x10);
          if (pvVar4 == (void *)0x0) {
            ppUVar8 = ppUVar1;
          }
          pUVar12->reserved = pvVar4;
          *ppUVar8 = pUVar12;
LAB_001b6750:
          pUVar10 = pUVar11;
          if ((pathOwned != 0) && (pcVar2 != pcVar3)) {
            (*memory->free)(memory,pcVar2);
          }
          goto LAB_001b6912;
        }
LAB_001b67aa:
        pUVar12 = pUVar11->next;
        if (pUVar12 == (UriPathSegmentStructA *)0x0) {
          uri->pathTail = pUVar11;
          return 1;
        }
        pUVar12->reserved = pUVar11;
        pUVar11 = pUVar12;
      }
    } while (pUVar11 != (UriPathSegmentStructA *)0x0);
  }
  return 1;
}

Assistant:

UriBool URI_FUNC(RemoveDotSegmentsEx)(URI_TYPE(Uri) * uri,
		UriBool relative, UriBool pathOwned, UriMemoryManager * memory) {
	URI_TYPE(PathSegment) * walker;
	if ((uri == NULL) || (uri->pathHead == NULL)) {
		return URI_TRUE;
	}

	walker = uri->pathHead;
	walker->reserved = NULL; /* Prev pointer */
	do {
		UriBool removeSegment = URI_FALSE;
		int len = (int)(walker->text.afterLast - walker->text.first);
		switch (len) {
		case 1:
			if ((walker->text.first)[0] == _UT('.')) {
				/* "." segment -> remove if not essential */
				URI_TYPE(PathSegment) * const prev = walker->reserved;
				URI_TYPE(PathSegment) * const nextBackup = walker->next;

				/*
				 * Is this dot segment essential,
				 * i.e. is there a chance of changing semantics by dropping this dot segment?
				 *
				 * For example, changing "./http://foo" into "http://foo" would change semantics
				 * and hence the dot segment is essential to that case and cannot be removed.
				 */
				removeSegment = URI_TRUE;
				if (relative && (walker == uri->pathHead) && (walker->next != NULL)) {
					const URI_CHAR * ch = walker->next->text.first;
					for (; ch < walker->next->text.afterLast; ch++) {
						if (*ch == _UT(':')) {
							removeSegment = URI_FALSE;
							break;
						}
					}
				}

				if (removeSegment) {
					/* .. then let's go remove that segment. */
					/* Last segment? */
					if (walker->next != NULL) {
						/* Not last segment, i.e. first or middle segment
						 * OLD: (prev|NULL) <- walker <- next
						 * NEW: (prev|NULL) <----------- next */
						walker->next->reserved = prev;

						if (prev == NULL) {
							/* First but not last segment
							 * OLD: head -> walker -> next
							 * NEW: head -----------> next */
							uri->pathHead = walker->next;
						} else {
							/* Middle segment
							 * OLD: prev -> walker -> next
							 * NEW: prev -----------> next */
							prev->next = walker->next;
						}

						if (pathOwned && (walker->text.first != walker->text.afterLast)) {
							memory->free(memory, (URI_CHAR *)walker->text.first);
						}
						memory->free(memory, walker);
					} else {
						/* Last segment */
						if (pathOwned && (walker->text.first != walker->text.afterLast)) {
							memory->free(memory, (URI_CHAR *)walker->text.first);
						}

						if (prev == NULL) {
							/* Last and first */
							if (URI_FUNC(IsHostSet)(uri)) {
								/* Replace "." with empty segment to represent trailing slash */
								walker->text.first = URI_FUNC(SafeToPointTo);
								walker->text.afterLast = URI_FUNC(SafeToPointTo);
							} else {
								memory->free(memory, walker);

								uri->pathHead = NULL;
								uri->pathTail = NULL;
							}
						} else {
							/* Last but not first, replace "." with empty segment to represent trailing slash */
							walker->text.first = URI_FUNC(SafeToPointTo);
							walker->text.afterLast = URI_FUNC(SafeToPointTo);
						}
					}

					walker = nextBackup;
				}
			}
			break;

		case 2:
			if (((walker->text.first)[0] == _UT('.'))
					&& ((walker->text.first)[1] == _UT('.'))) {
				/* Path ".." -> remove this and the previous segment */
				URI_TYPE(PathSegment) * const prev = walker->reserved;
				URI_TYPE(PathSegment) * prevPrev;
				URI_TYPE(PathSegment) * const nextBackup = walker->next;

				removeSegment = URI_TRUE;
				if (relative) {
					if (prev == NULL) {
						/* We cannot remove traversal beyond because the
						 * URI is relative and may be resolved later.
						 * So we can simplify "a/../b/d" to "b/d" but
						 * we cannot simplify "../b/d" (outside of reference resolution). */
						removeSegment = URI_FALSE;
					} else if ((prev != NULL)
							&& ((prev->text.afterLast - prev->text.first) == 2)
							&& ((prev->text.first)[0] == _UT('.'))
							&& ((prev->text.first)[1] == _UT('.'))) {
						/* We need to protect against mis-simplifying "a/../../b" to "a/b". */
						removeSegment = URI_FALSE;
					}
				}

				if (removeSegment) {
					if (prev != NULL) {
						/* Not first segment */
						prevPrev = prev->reserved;
						if (prevPrev != NULL) {
							/* Not even prev is the first one
							 * OLD: prevPrev -> prev -> walker -> (next|NULL)
							 * NEW: prevPrev -------------------> (next|NULL) */
							prevPrev->next = walker->next;
							if (walker->next != NULL) {
								/* Update parent relationship as well
								 * OLD: prevPrev <- prev <- walker <- next
								 * NEW: prevPrev <------------------- next */
								walker->next->reserved = prevPrev;
							} else {
								/* Last segment -> insert "" segment to represent trailing slash, update tail */
								URI_TYPE(PathSegment) * const segment = memory->calloc(memory, 1, sizeof(URI_TYPE(PathSegment)));
								if (segment == NULL) {
									if (pathOwned && (walker->text.first != walker->text.afterLast)) {
										memory->free(memory, (URI_CHAR *)walker->text.first);
									}
									memory->free(memory, walker);

									if (pathOwned && (prev->text.first != prev->text.afterLast)) {
										memory->free(memory, (URI_CHAR *)prev->text.first);
									}
									memory->free(memory, prev);

									return URI_FALSE; /* Raises malloc error */
								}
								segment->text.first = URI_FUNC(SafeToPointTo);
								segment->text.afterLast = URI_FUNC(SafeToPointTo);
								prevPrev->next = segment;
								uri->pathTail = segment;
							}

							if (pathOwned && (walker->text.first != walker->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)walker->text.first);
							}
							memory->free(memory, walker);

							if (pathOwned && (prev->text.first != prev->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)prev->text.first);
							}
							memory->free(memory, prev);

							walker = nextBackup;
						} else {
							/* Prev is the first segment */
							if (walker->next != NULL) {
								uri->pathHead = walker->next;
								walker->next->reserved = NULL;

								if (pathOwned && (walker->text.first != walker->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)walker->text.first);
								}
								memory->free(memory, walker);
							} else {
								/* Re-use segment for "" path segment to represent trailing slash, update tail */
								URI_TYPE(PathSegment) * const segment = walker;
								if (pathOwned && (segment->text.first != segment->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)segment->text.first);
								}
								segment->text.first = URI_FUNC(SafeToPointTo);
								segment->text.afterLast = URI_FUNC(SafeToPointTo);
								uri->pathHead = segment;
								uri->pathTail = segment;
							}

							if (pathOwned && (prev->text.first != prev->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)prev->text.first);
							}
							memory->free(memory, prev);

							walker = nextBackup;
						}
					} else {
						URI_TYPE(PathSegment) * const anotherNextBackup = walker->next;
						int freeWalker = URI_TRUE;

						/* First segment */
						if (walker->next != NULL) {
							/* First segment of multiple -> update head
							 * OLD: head -> walker -> next
							 * NEW: head -----------> next */
							uri->pathHead = walker->next;

							/* Update parent link as well
							 * OLD: head <- walker <- next
							 * NEW: head <----------- next */
							walker->next->reserved = NULL;
						} else {
							if (uri->absolutePath) {
								/* First and only segment -> update head
								 * OLD: head -> walker -> NULL
								 * NEW: head -----------> NULL */
								uri->pathHead = NULL;

								/* Last segment -> update tail
								 * OLD: tail -> walker
								 * NEW: tail -> NULL */
								uri->pathTail = NULL;
							} else {
								/* Re-use segment for "" path segment to represent trailing slash,
								 * then update head and tail */
								if (pathOwned && (walker->text.first != walker->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)walker->text.first);
								}
								walker->text.first = URI_FUNC(SafeToPointTo);
								walker->text.afterLast = URI_FUNC(SafeToPointTo);
								freeWalker = URI_FALSE;
							}
						}

						if (freeWalker) {
							if (pathOwned && (walker->text.first != walker->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)walker->text.first);
							}
							memory->free(memory, walker);
						}

						walker = anotherNextBackup;
					}
				}
			}
			break;
		} /* end of switch */

		if (!removeSegment) {
			/* .. then let's move to the next element, and start again. */
			if (walker->next != NULL) {
				walker->next->reserved = walker;
			} else {
				/* Last segment -> update tail */
				uri->pathTail = walker;
			}
			walker = walker->next;
		}
	} while (walker != NULL);

	return URI_TRUE;
}